

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::StringMaker<wchar_t_const*,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<wchar_t_const*,void> *this,wchar_t *str)

{
  allocator local_31;
  wstring local_30;
  
  if (this == (StringMaker<wchar_t_const*,void> *)0x0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"{null string}",(allocator *)&local_30);
  }
  else {
    std::__cxx11::wstring::wstring((wstring *)&local_30,(wchar_t *)this,&local_31);
    StringMaker<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
    ::convert(__return_storage_ptr__,&local_30);
    std::__cxx11::wstring::~wstring((wstring *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<wchar_t const*>::convert(wchar_t const * str) {
    if (str) {
        return ::Catch::Detail::stringify(std::wstring{ str });
    } else {
        return{ "{null string}" };
    }
}